

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall
JsonString_ControlCharacterUTF16_Test::~JsonString_ControlCharacterUTF16_Test
          (JsonString_ControlCharacterUTF16_Test *this)

{
  JsonString_ControlCharacterUTF16_Test *this_local;
  
  ~JsonString_ControlCharacterUTF16_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, ControlCharacterUTF16) {
    EXPECT_CALL (callbacks_, string_value ("\t")).Times (1);

    auto p = json::make_parser (proxy_);
    p.input (R"("\u0009")").eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{9U, 1U}));
}